

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O2

void __thiscall beast::unit_test::detail::reporter<void>::reporter(reporter<void> *this,ostream *os)

{
  allocator local_59;
  string local_58;
  string local_38;
  
  runner::runner(&this->super_runner);
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__reporter_002f72e0;
  this->os_ = os;
  results::results(&this->results_);
  ::std::__cxx11::string::string((string *)&local_38,"",&local_59);
  suite_results::suite_results(&this->suite_results_,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::string((string *)&local_58,"",&local_59);
  case_results::case_results(&this->case_results_,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

reporter<_>::
reporter(std::ostream& os)
    : os_(os)
{
}